

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

void Fra_OneHotEstimateCoverage(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  int iVar1;
  uint uVar2;
  int n;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *p_00;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  abctime aVar8;
  abctime clk;
  int Counter;
  int nCovered;
  int Out2;
  int Out1;
  int w;
  int i;
  uint *pSimTot;
  uint *pSim2;
  uint *pSim1;
  Vec_Ptr_t *vSimInfo;
  int nRegs;
  int nSimWords;
  Vec_Int_t *vOneHots_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pManAig);
  aVar4 = Abc_Clock();
  p_00 = Vec_PtrAllocSimInfo(iVar1 + 1,0x4000);
  Aig_ManRandom(1);
  for (Out1 = 0; Out1 < iVar1; Out1 = Out1 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,Out1);
    for (Out2 = 0; Out2 < 0x4000; Out2 = Out2 + 1) {
      uVar2 = Fra_ObjRandomSim();
      *(uint *)((long)pvVar5 + (long)Out2 * 4) = uVar2;
    }
  }
  pvVar5 = Vec_PtrEntry(p_00,iVar1);
  memset(pvVar5,0,0x10000);
  Out1 = 0;
  do {
    iVar1 = Vec_IntSize(vOneHots);
    if (iVar1 <= Out1) {
      clk._4_4_ = 0;
      for (Out2 = 0; Out2 < 0x4000; Out2 = Out2 + 1) {
        iVar1 = Aig_WordCountOnes(*(uint *)((long)pvVar5 + (long)Out2 * 4));
        clk._4_4_ = iVar1 + clk._4_4_;
      }
      Vec_PtrFree(p_00);
      printf("Care states ratio = %f. ",((double)(0x80000 - clk._4_4_) * 1.0) / 524288.0);
      printf("(%d out of %d patterns)  ",(ulong)(0x80000 - clk._4_4_),0x80000);
      Abc_Print(1,"%s =","Time");
      aVar8 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar4) * 1.0) / 1000000.0);
      return;
    }
    iVar1 = Vec_IntEntry(vOneHots,Out1);
    n = Vec_IntEntry(vOneHots,Out1 + 1);
    if ((iVar1 != 0) || (n != 0)) {
      iVar3 = Fra_LitReg(iVar1);
      pvVar6 = Vec_PtrEntry(p_00,iVar3);
      iVar3 = Fra_LitReg(n);
      pvVar7 = Vec_PtrEntry(p_00,iVar3);
      iVar3 = Fra_LitSign(iVar1);
      if ((iVar3 == 0) || (iVar3 = Fra_LitSign(n), iVar3 == 0)) {
        iVar1 = Fra_LitSign(iVar1);
        if (iVar1 == 0) {
          iVar1 = Fra_LitSign(n);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                          ,0x175,"void Fra_OneHotEstimateCoverage(Fra_Man_t *, Vec_Int_t *)");
          }
          for (Out2 = 0; Out2 < 0x4000; Out2 = Out2 + 1) {
            *(uint *)((long)pvVar5 + (long)Out2 * 4) =
                 (*(uint *)((long)pvVar6 + (long)Out2 * 4) ^ 0xffffffff) &
                 *(uint *)((long)pvVar7 + (long)Out2 * 4) | *(uint *)((long)pvVar5 + (long)Out2 * 4)
            ;
          }
        }
        else {
          for (Out2 = 0; Out2 < 0x4000; Out2 = Out2 + 1) {
            *(uint *)((long)pvVar5 + (long)Out2 * 4) =
                 *(uint *)((long)pvVar6 + (long)Out2 * 4) &
                 (*(uint *)((long)pvVar7 + (long)Out2 * 4) ^ 0xffffffff) |
                 *(uint *)((long)pvVar5 + (long)Out2 * 4);
          }
        }
      }
      else {
        for (Out2 = 0; Out2 < 0x4000; Out2 = Out2 + 1) {
          *(uint *)((long)pvVar5 + (long)Out2 * 4) =
               *(uint *)((long)pvVar6 + (long)Out2 * 4) & *(uint *)((long)pvVar7 + (long)Out2 * 4) |
               *(uint *)((long)pvVar5 + (long)Out2 * 4);
        }
      }
    }
    Out1 = Out1 + 2;
  } while( true );
}

Assistant:

void Fra_OneHotEstimateCoverage( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int nSimWords = (1<<14);
    int nRegs = Aig_ManRegNum(p->pManAig);
    Vec_Ptr_t * vSimInfo;
    unsigned * pSim1, * pSim2, * pSimTot;
    int i, w, Out1, Out2, nCovered, Counter = 0;
    abctime clk = Abc_Clock();

    // generate random sim-info at register outputs
    vSimInfo = Vec_PtrAllocSimInfo( nRegs + 1, nSimWords );
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    for ( i = 0; i < nRegs; i++ )
    {
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, i );
        for ( w = 0; w < nSimWords; w++ )
            pSim1[w] = Fra_ObjRandomSim();
    }
    pSimTot = (unsigned *)Vec_PtrEntry( vSimInfo, nRegs );

    // collect simulation info
    memset( pSimTot, 0, sizeof(unsigned) * nSimWords );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
//printf( "(%c%d,%c%d) ", 
//Fra_LitSign(Out1)? '-': '+', Fra_LitReg(Out1), 
//Fra_LitSign(Out2)? '-': '+', Fra_LitReg(Out2) ); 
        Counter++;
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out1) );
        pSim2 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out2) );
        if ( Fra_LitSign(Out1) && Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] &  pSim2[w];
        else if ( Fra_LitSign(Out1) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] & ~pSim2[w];
        else if ( Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |= ~pSim1[w] &  pSim2[w];
        else
            assert( 0 );
    }
//printf( "\n" );
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nSimWords; w++ )
        nCovered += Aig_WordCountOnes( pSimTot[w] );
    Vec_PtrFree( vSimInfo );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nSimWords * 32 - nCovered) / (nSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nSimWords * 32 - nCovered, nSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}